

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src,bool before)

{
  bool bVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_type sVar4;
  cmListFileBacktrace local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d0;
  const_iterator local_c8;
  undefined1 local_c0 [8];
  cmListFileBacktrace lfbt;
  TargetPropertyEntryFinder local_98;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  undefined1 local_78 [8];
  cmSourceFileLocation sfl;
  bool before_local;
  string *src_local;
  cmTarget *this_local;
  
  sfl.Name.field_2._M_local_buf[0xf] = before;
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmSourceFileLocation::cmSourceFileLocation
            ((cmSourceFileLocation *)local_78,pcVar2->Makefile,src,Known);
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  local_88._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       std::
       vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&pcVar2->SourceEntries);
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  local_90._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       std::
       vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&pcVar2->SourceEntries);
  TargetPropertyEntryFinder::TargetPropertyEntryFinder(&local_98,(cmSourceFileLocation *)local_78);
  local_80 = std::
             find_if<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,TargetPropertyEntryFinder>
                       (local_88,local_90,local_98);
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&pcVar2->SourceEntries);
  bVar1 = __gnu_cxx::operator==
                    (&local_80,
                     (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  if (bVar1) {
    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
              (&this->impl);
    cmMakefile::GetBacktrace((cmMakefile *)local_c0);
    pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    if ((sfl.Name.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_d0._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&pcVar3->SourceEntries);
    }
    else {
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_d0._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&pcVar3->SourceEntries);
    }
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
    ::__normal_iterator<BT<std::__cxx11::string>*>
              ((__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                *)&local_c8,&local_d0);
    std::__cxx11::string::string((string *)&local_120,(string *)src);
    cmListFileBacktrace::cmListFileBacktrace(&local_130,(cmListFileBacktrace *)local_c0);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_100,&local_120,&local_130);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(&pcVar2->SourceEntries,local_c8,&local_100);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_100);
    cmListFileBacktrace::~cmListFileBacktrace(&local_130);
    std::__cxx11::string::~string((string *)&local_120);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
  }
  sVar4 = cmGeneratorExpression::Find(src);
  if (sVar4 == 0xffffffffffffffff) {
    pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    this_local = (cmTarget *)cmMakefile::GetOrCreateSource(pcVar2->Makefile,src,false,Known);
  }
  else {
    this_local = (cmTarget *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)local_78);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src, bool before)
{
  cmSourceFileLocation sfl(this->impl->Makefile, src,
                           cmSourceFileLocationKind::Known);
  if (std::find_if(
        this->impl->SourceEntries.begin(), this->impl->SourceEntries.end(),
        TargetPropertyEntryFinder(sfl)) == this->impl->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
    this->impl->SourceEntries.insert(before ? this->impl->SourceEntries.begin()
                                            : this->impl->SourceEntries.end(),
                                     BT<std::string>(src, lfbt));
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return nullptr;
  }
  return this->impl->Makefile->GetOrCreateSource(
    src, false, cmSourceFileLocationKind::Known);
}